

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleShapeEx.cpp
# Opt level: O2

bool __thiscall
cbtPrimitiveTriangle::overlap_test_conservative
          (cbtPrimitiveTriangle *this,cbtPrimitiveTriangle *other)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  cbtVector4 *pcVar7;
  cbtScalar cVar8;
  cbtScalar cVar9;
  cbtScalar cVar10;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  
  pcVar7 = &this->m_plane;
  fVar1 = this->m_margin + other->m_margin;
  cVar8 = bt_distance_point_plane(pcVar7,other->m_vertices);
  cVar9 = bt_distance_point_plane(pcVar7,other->m_vertices + 1);
  cVar10 = bt_distance_point_plane(pcVar7,other->m_vertices + 2);
  if (((cVar8 <= fVar1) || (cVar9 <= fVar1)) || (cVar10 <= fVar1)) {
    pcVar7 = &other->m_plane;
    cVar8 = bt_distance_point_plane(pcVar7,this->m_vertices);
    cVar9 = bt_distance_point_plane(pcVar7,this->m_vertices + 1);
    cVar10 = bt_distance_point_plane(pcVar7,this->m_vertices + 2);
    auVar5._4_4_ = extraout_XMM0_Db;
    auVar5._0_4_ = cVar8;
    auVar5._8_4_ = extraout_XMM0_Dc;
    auVar5._12_4_ = extraout_XMM0_Dd;
    uVar2 = vcmpps_avx512vl(ZEXT416((uint)fVar1),auVar5,5);
    auVar4._4_4_ = extraout_XMM0_Db_00;
    auVar4._0_4_ = cVar9;
    auVar4._8_4_ = extraout_XMM0_Dc_00;
    auVar4._12_4_ = extraout_XMM0_Dd_00;
    uVar3 = vcmpps_avx512vl(ZEXT416((uint)fVar1),auVar4,5);
    bVar6 = cVar10 <= fVar1 | (byte)uVar2 | (byte)uVar3;
  }
  else {
    bVar6 = 0;
  }
  return (bool)(bVar6 & 1);
}

Assistant:

bool cbtPrimitiveTriangle::overlap_test_conservative(const cbtPrimitiveTriangle& other)
{
	cbtScalar total_margin = m_margin + other.m_margin;
	// classify points on other triangle
	cbtScalar dis0 = bt_distance_point_plane(m_plane, other.m_vertices[0]) - total_margin;

	cbtScalar dis1 = bt_distance_point_plane(m_plane, other.m_vertices[1]) - total_margin;

	cbtScalar dis2 = bt_distance_point_plane(m_plane, other.m_vertices[2]) - total_margin;

	if (dis0 > 0.0f && dis1 > 0.0f && dis2 > 0.0f) return false;

	// classify points on this triangle
	dis0 = bt_distance_point_plane(other.m_plane, m_vertices[0]) - total_margin;

	dis1 = bt_distance_point_plane(other.m_plane, m_vertices[1]) - total_margin;

	dis2 = bt_distance_point_plane(other.m_plane, m_vertices[2]) - total_margin;

	if (dis0 > 0.0f && dis1 > 0.0f && dis2 > 0.0f) return false;

	return true;
}